

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

double duckdb::GetPreviousPowerOfTen(double input)

{
  double dVar1;
  
  dVar1 = 1.0;
  if (1.0 <= input) {
    for (; dVar1 < input; dVar1 = dVar1 * 10.0) {
    }
    dVar1 = dVar1 / 10.0;
  }
  else {
    for (dVar1 = 1.0; input < dVar1; dVar1 = dVar1 / 10.0) {
    }
  }
  return dVar1;
}

Assistant:

static double GetPreviousPowerOfTen(double input) {
	double power_of_ten = 1;
	if (input < 1) {
		while (power_of_ten > input) {
			power_of_ten /= 10;
		}
		return power_of_ten;
	}
	while (power_of_ten < input) {
		power_of_ten *= 10;
	}
	return power_of_ten / 10;
}